

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::VicinityGroup> *
metaf::VicinityGroup::parse(string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  int in_EDX;
  VicinityGroup *in_RDI;
  optional<metaf::VicinityGroup> notRecognised;
  undefined4 in_stack_fffffffffffff988;
  Type in_stack_fffffffffffff98c;
  VicinityGroup *this;
  undefined1 local_6c [96];
  int local_c;
  
  this = in_RDI;
  local_c = in_EDX;
  std::optional<metaf::VicinityGroup>::optional((optional<metaf::VicinityGroup> *)0x264c05);
  if (local_c == 4) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                  in_stack_fffffffffffff988));
    if (bVar1) {
      VicinityGroup(this,in_stack_fffffffffffff98c);
      std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                ((optional<metaf::VicinityGroup> *)this,
                 (VicinityGroup *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                    in_stack_fffffffffffff988));
      if (bVar1) {
        VicinityGroup(this,in_stack_fffffffffffff98c);
        std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                  ((optional<metaf::VicinityGroup> *)this,
                   (VicinityGroup *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                       in_stack_fffffffffffff988));
        if (bVar1) {
          VicinityGroup(this,in_stack_fffffffffffff98c);
          std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                    ((optional<metaf::VicinityGroup> *)this,
                     (VicinityGroup *)CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988))
          ;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                           in_stack_fffffffffffff988));
          if (bVar1) {
            VicinityGroup(this,in_stack_fffffffffffff98c);
            std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                      ((optional<metaf::VicinityGroup> *)this,
                       (VicinityGroup *)
                       CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                             in_stack_fffffffffffff988));
            if (bVar1) {
              VicinityGroup(this,in_stack_fffffffffffff98c);
              std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                        ((optional<metaf::VicinityGroup> *)this,
                         (VicinityGroup *)
                         CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                               in_stack_fffffffffffff988));
              if (bVar1) {
                VicinityGroup(this,in_stack_fffffffffffff98c);
                std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                          ((optional<metaf::VicinityGroup> *)this,
                           (VicinityGroup *)
                           CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                 in_stack_fffffffffffff988));
                if (bVar1) {
                  VicinityGroup(this,in_stack_fffffffffffff98c);
                  std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                            ((optional<metaf::VicinityGroup> *)this,
                             (VicinityGroup *)
                             CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                   in_stack_fffffffffffff988));
                  if (bVar1) {
                    VicinityGroup(this,in_stack_fffffffffffff98c);
                    std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                              ((optional<metaf::VicinityGroup> *)this,
                               (VicinityGroup *)
                               CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                     in_stack_fffffffffffff988));
                    if (bVar1) {
                      VicinityGroup(this,in_stack_fffffffffffff98c);
                      std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                                ((optional<metaf::VicinityGroup> *)this,
                                 (VicinityGroup *)
                                 CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                       in_stack_fffffffffffff988));
                      if (bVar1) {
                        VicinityGroup(this,in_stack_fffffffffffff98c);
                        std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                                  ((optional<metaf::VicinityGroup> *)this,
                                   (VicinityGroup *)
                                   CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                         in_stack_fffffffffffff988))
                        ;
                        if (bVar1) {
                          VicinityGroup(this,in_stack_fffffffffffff98c);
                          std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                                    ((optional<metaf::VicinityGroup> *)this,
                                     (VicinityGroup *)
                                     CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                 );
                          if ((!bVar1) &&
                             (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  ), !bVar1)) {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  );
                            if ((bVar1) ||
                               (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  ), bVar1)) {
                              VicinityGroup(this,in_stack_fffffffffffff98c);
                              std::optional<metaf::VicinityGroup>::
                              optional<metaf::VicinityGroup,_true>
                                        ((optional<metaf::VicinityGroup> *)this,
                                         (VicinityGroup *)
                                         CONCAT44(in_stack_fffffffffffff98c,
                                                  in_stack_fffffffffffff988));
                              return (optional<metaf::VicinityGroup> *)in_RDI;
                            }
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  );
                            if ((bVar1) ||
                               (bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  ), bVar1)) {
                              VicinityGroup(this,in_stack_fffffffffffff98c);
                              std::optional<metaf::VicinityGroup>::
                              optional<metaf::VicinityGroup,_true>
                                        ((optional<metaf::VicinityGroup> *)this,
                                         (VicinityGroup *)
                                         CONCAT44(in_stack_fffffffffffff98c,
                                                  in_stack_fffffffffffff988));
                              return (optional<metaf::VicinityGroup> *)in_RDI;
                            }
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  );
                            if (bVar1) {
                              VicinityGroup(this,in_stack_fffffffffffff98c);
                              std::optional<metaf::VicinityGroup>::
                              optional<metaf::VicinityGroup,_true>
                                        ((optional<metaf::VicinityGroup> *)this,
                                         (VicinityGroup *)
                                         CONCAT44(in_stack_fffffffffffff98c,
                                                  in_stack_fffffffffffff988));
                              return (optional<metaf::VicinityGroup> *)in_RDI;
                            }
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  );
                            if (!bVar1) {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  );
                              if (bVar1) {
                                VicinityGroup(this,in_stack_fffffffffffff98c);
                                std::optional<metaf::VicinityGroup>::
                                optional<metaf::VicinityGroup,_true>
                                          ((optional<metaf::VicinityGroup> *)this,
                                           (VicinityGroup *)
                                           CONCAT44(in_stack_fffffffffffff98c,
                                                    in_stack_fffffffffffff988));
                                return (optional<metaf::VicinityGroup> *)in_RDI;
                              }
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  );
                              if (!bVar1) {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)this,(char *)CONCAT44(in_stack_fffffffffffff98c,
                                                                          in_stack_fffffffffffff988)
                                                  );
                                if (!bVar1) {
                                  memcpy(this,local_6c,0x54);
                                  return (optional<metaf::VicinityGroup> *)in_RDI;
                                }
                                VicinityGroup(this,in_stack_fffffffffffff98c);
                                std::optional<metaf::VicinityGroup>::
                                optional<metaf::VicinityGroup,_true>
                                          ((optional<metaf::VicinityGroup> *)this,
                                           (VicinityGroup *)
                                           CONCAT44(in_stack_fffffffffffff98c,
                                                    in_stack_fffffffffffff988));
                                return (optional<metaf::VicinityGroup> *)in_RDI;
                              }
                              VicinityGroup(this,in_stack_fffffffffffff98c);
                              std::optional<metaf::VicinityGroup>::
                              optional<metaf::VicinityGroup,_true>
                                        ((optional<metaf::VicinityGroup> *)this,
                                         (VicinityGroup *)
                                         CONCAT44(in_stack_fffffffffffff98c,
                                                  in_stack_fffffffffffff988));
                              return (optional<metaf::VicinityGroup> *)in_RDI;
                            }
                            VicinityGroup(this,in_stack_fffffffffffff98c);
                            std::optional<metaf::VicinityGroup>::
                            optional<metaf::VicinityGroup,_true>
                                      ((optional<metaf::VicinityGroup> *)this,
                                       (VicinityGroup *)
                                       CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988)
                                      );
                            return (optional<metaf::VicinityGroup> *)in_RDI;
                          }
                          VicinityGroup(this,in_stack_fffffffffffff98c);
                          std::optional<metaf::VicinityGroup>::optional<metaf::VicinityGroup,_true>
                                    ((optional<metaf::VicinityGroup> *)this,
                                     (VicinityGroup *)
                                     CONCAT44(in_stack_fffffffffffff98c,in_stack_fffffffffffff988));
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    memcpy(this,local_6c,0x54);
  }
  return (optional<metaf::VicinityGroup> *)in_RDI;
}

Assistant:

std::optional<VicinityGroup> VicinityGroup::parse(
	const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void) reportMetadata;
	std::optional<VicinityGroup> notRecognised;
	if (reportPart != ReportPart::RMK) return notRecognised;
	if (group == "TS") return VicinityGroup(Type::THUNDERSTORM);
	if (group == "CB") return VicinityGroup(Type::CUMULONIMBUS);
	if (group == "CBMAM") return VicinityGroup(Type::CUMULONIMBUS_MAMMATUS);
	if (group == "ACC") return VicinityGroup(Type::ALTOCUMULUS_CASTELLANUS);
	if (group == "TCU") return VicinityGroup(Type::TOWERING_CUMULUS);
	if (group == "SCSL") return VicinityGroup(Type::STRATOCUMULUS_STANDING_LENTICULAR);
	if (group == "ACSL") return VicinityGroup(Type::ALTOCUMULUS_STANDING_LENTICULAR);
	if (group == "CCSL") return VicinityGroup(Type::CIRROCUMULUS_STANDING_LENTICULAR);
	if (group == "ROTOR") return VicinityGroup(Type::ROTOR_CLOUD);
	if (group == "VIRGA") return VicinityGroup(Type::VIRGA);
	if (group == "VCSH") return VicinityGroup(Type::PRECIPITATION_IN_VICINITY);
	if (group == "FOG" || group == "FG") return VicinityGroup(Type::FOG);
	if (group == "HAZE" || group == "HZ") return VicinityGroup(Type::HAZE);
	if (group == "SMOKE" || group == "FU") return VicinityGroup(Type::SMOKE);
	if (group == "BLSN") return VicinityGroup(Type::BLOWING_SNOW);
	if (group == "BLDU") return VicinityGroup(Type::BLOWING_DUST);
	if (group == "BLSA") return VicinityGroup(Type::BLOWING_SAND);
	if (group == "MIFG") return VicinityGroup(Type::FOG_SHALLOW);
	if (group == "BCFG") return VicinityGroup(Type::FOG_PATCHES);
	return notRecognised;
}